

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_jp2_header_handler_t * jp2_img_find_handler(int p_id)

{
  OPJ_UINT32 l_handler_size;
  OPJ_UINT32 i;
  int p_id_local;
  
  i = 0;
  while( true ) {
    if (5 < i) {
      return (opj_jp2_header_handler_t *)0x0;
    }
    if (jp2_img_header[i].id == p_id) break;
    i = i + 1;
  }
  return jp2_img_header + i;
}

Assistant:

static const opj_jp2_header_handler_t * jp2_img_find_handler (
												int p_id
												)
{
	OPJ_UINT32 i, l_handler_size = sizeof(jp2_img_header) / sizeof(opj_jp2_header_handler_t);
	for (i=0;i<l_handler_size;++i)
	{
		if (jp2_img_header[i].id == p_id) {
			return &jp2_img_header[i];
		}
	}

	return NULL;
}